

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerCommitPhaseOne(Pager *pPager,char *zMaster,int noSync)

{
  char *pPager_00;
  int iVar1;
  PgHdr *pList_00;
  DbPage *pDStack_38;
  Pgno nNew;
  PgHdr *pPageOne;
  PgHdr *pList;
  int rc;
  int noSync_local;
  char *zMaster_local;
  Pager *pPager_local;
  
  pList._0_4_ = 0;
  if (pPager->errCode == 0) {
    pList._4_4_ = noSync;
    _rc = zMaster;
    zMaster_local = (char *)pPager;
    iVar1 = sqlite3FaultSim(400);
    if (iVar1 == 0) {
      if ((byte)zMaster_local[0x15] < 3) {
        pPager_local._4_4_ = 0;
      }
      else {
        iVar1 = pagerFlushOnCommit((Pager *)zMaster_local,1);
        if (iVar1 == 0) {
          sqlite3BackupRestart(*(sqlite3_backup **)(zMaster_local + 0x70));
        }
        else if (*(long *)(zMaster_local + 0x120) == 0) {
          pList._0_4_ = pager_incr_changecounter((Pager *)zMaster_local,0);
          if ((((int)pList == 0) &&
              (pList._0_4_ = writeMasterJournal((Pager *)zMaster_local,_rc), (int)pList == 0)) &&
             (pList._0_4_ = syncJournal((Pager *)zMaster_local,0), pPager_00 = zMaster_local,
             (int)pList == 0)) {
            pList_00 = sqlite3PcacheDirtyList(*(PCache **)(zMaster_local + 0x118));
            pList._0_4_ = pager_write_pagelist((Pager *)pPager_00,pList_00);
            if ((((int)pList == 0) &&
                ((sqlite3PcacheCleanAll(*(PCache **)(zMaster_local + 0x118)),
                 *(uint *)(zMaster_local + 0x20) <= *(uint *)(zMaster_local + 0x28) ||
                 (pList._0_4_ = pager_truncate((Pager *)zMaster_local,
                                               *(int *)(zMaster_local + 0x20) -
                                               (uint)(*(int *)(zMaster_local + 0x20) ==
                                                     sqlite3PendingByte /
                                                     *(int *)(zMaster_local + 0xbc) + 1)),
                 (int)pList == 0)))) && (pList._4_4_ == 0)) {
              pList._0_4_ = sqlite3PagerSync((Pager *)zMaster_local,_rc);
            }
          }
        }
        else {
          pPageOne = sqlite3PcacheDirtyList(*(PCache **)(zMaster_local + 0x118));
          pDStack_38 = (DbPage *)0x0;
          if (pPageOne == (PgHdr *)0x0) {
            pList._0_4_ = sqlite3PagerGet((Pager *)zMaster_local,1,&stack0xffffffffffffffc8,0);
            pPageOne = pDStack_38;
            pDStack_38->pDirty = (PgHdr *)0x0;
          }
          if (pPageOne != (PgHdr *)0x0) {
            pList._0_4_ = pagerWalFrames((Pager *)zMaster_local,pPageOne,
                                         *(Pgno *)(zMaster_local + 0x20),1);
          }
          sqlite3PagerUnref(pDStack_38);
          if ((int)pList == 0) {
            sqlite3PcacheCleanAll(*(PCache **)(zMaster_local + 0x118));
          }
        }
        if (((int)pList == 0) && (*(long *)(zMaster_local + 0x120) == 0)) {
          zMaster_local[0x15] = '\x05';
        }
        pPager_local._4_4_ = (int)pList;
      }
    }
    else {
      pPager_local._4_4_ = 10;
    }
  }
  else {
    pPager_local._4_4_ = pPager->errCode;
  }
  return pPager_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerCommitPhaseOne(
  Pager *pPager,                  /* Pager object */
  const char *zMaster,            /* If not NULL, the master journal name */
  int noSync                      /* True to omit the xSync on the db file */
){
  int rc = SQLITE_OK;             /* Return code */

  assert( pPager->eState==PAGER_WRITER_LOCKED
       || pPager->eState==PAGER_WRITER_CACHEMOD
       || pPager->eState==PAGER_WRITER_DBMOD
       || pPager->eState==PAGER_ERROR
  );
  assert( assert_pager_state(pPager) );

  /* If a prior error occurred, report that error again. */
  if( NEVER(pPager->errCode) ) return pPager->errCode;

  /* Provide the ability to easily simulate an I/O error during testing */
  if( sqlite3FaultSim(400) ) return SQLITE_IOERR;

  PAGERTRACE(("DATABASE SYNC: File=%s zMaster=%s nSize=%d\n", 
      pPager->zFilename, zMaster, pPager->dbSize));

  /* If no database changes have been made, return early. */
  if( pPager->eState<PAGER_WRITER_CACHEMOD ) return SQLITE_OK;

  assert( MEMDB==0 || pPager->tempFile );
  assert( isOpen(pPager->fd) || pPager->tempFile );
  if( 0==pagerFlushOnCommit(pPager, 1) ){
    /* If this is an in-memory db, or no pages have been written to, or this
    ** function has already been called, it is mostly a no-op.  However, any
    ** backup in progress needs to be restarted.  */
    sqlite3BackupRestart(pPager->pBackup);
  }else{
    if( pagerUseWal(pPager) ){
      PgHdr *pList = sqlite3PcacheDirtyList(pPager->pPCache);
      PgHdr *pPageOne = 0;
      if( pList==0 ){
        /* Must have at least one page for the WAL commit flag.
        ** Ticket [2d1a5c67dfc2363e44f29d9bbd57f] 2011-05-18 */
        rc = sqlite3PagerGet(pPager, 1, &pPageOne, 0);
        pList = pPageOne;
        pList->pDirty = 0;
      }
      assert( rc==SQLITE_OK );
      if( ALWAYS(pList) ){
        rc = pagerWalFrames(pPager, pList, pPager->dbSize, 1);
      }
      sqlite3PagerUnref(pPageOne);
      if( rc==SQLITE_OK ){
        sqlite3PcacheCleanAll(pPager->pPCache);
      }
    }else{
      /* The following block updates the change-counter. Exactly how it
      ** does this depends on whether or not the atomic-update optimization
      ** was enabled at compile time, and if this transaction meets the 
      ** runtime criteria to use the operation: 
      **
      **    * The file-system supports the atomic-write property for
      **      blocks of size page-size, and 
      **    * This commit is not part of a multi-file transaction, and
      **    * Exactly one page has been modified and store in the journal file.
      **
      ** If the optimization was not enabled at compile time, then the
      ** pager_incr_changecounter() function is called to update the change
      ** counter in 'indirect-mode'. If the optimization is compiled in but
      ** is not applicable to this transaction, call sqlite3JournalCreate()
      ** to make sure the journal file has actually been created, then call
      ** pager_incr_changecounter() to update the change-counter in indirect
      ** mode. 
      **
      ** Otherwise, if the optimization is both enabled and applicable,
      ** then call pager_incr_changecounter() to update the change-counter
      ** in 'direct' mode. In this case the journal file will never be
      ** created for this transaction.
      */
  #ifdef SQLITE_ENABLE_ATOMIC_WRITE
      PgHdr *pPg;
      assert( isOpen(pPager->jfd) 
           || pPager->journalMode==PAGER_JOURNALMODE_OFF 
           || pPager->journalMode==PAGER_JOURNALMODE_WAL 
      );
      if( !zMaster && isOpen(pPager->jfd) 
       && pPager->journalOff==jrnlBufferSize(pPager) 
       && pPager->dbSize>=pPager->dbOrigSize
       && (0==(pPg = sqlite3PcacheDirtyList(pPager->pPCache)) || 0==pPg->pDirty)
      ){
        /* Update the db file change counter via the direct-write method. The 
        ** following call will modify the in-memory representation of page 1 
        ** to include the updated change counter and then write page 1 
        ** directly to the database file. Because of the atomic-write 
        ** property of the host file-system, this is safe.
        */
        rc = pager_incr_changecounter(pPager, 1);
      }else{
        rc = sqlite3JournalCreate(pPager->jfd);
        if( rc==SQLITE_OK ){
          rc = pager_incr_changecounter(pPager, 0);
        }
      }
  #else
      rc = pager_incr_changecounter(pPager, 0);
  #endif
      if( rc!=SQLITE_OK ) goto commit_phase_one_exit;
  
      /* Write the master journal name into the journal file. If a master 
      ** journal file name has already been written to the journal file, 
      ** or if zMaster is NULL (no master journal), then this call is a no-op.
      */
      rc = writeMasterJournal(pPager, zMaster);
      if( rc!=SQLITE_OK ) goto commit_phase_one_exit;
  
      /* Sync the journal file and write all dirty pages to the database.
      ** If the atomic-update optimization is being used, this sync will not 
      ** create the journal file or perform any real IO.
      **
      ** Because the change-counter page was just modified, unless the
      ** atomic-update optimization is used it is almost certain that the
      ** journal requires a sync here. However, in locking_mode=exclusive
      ** on a system under memory pressure it is just possible that this is 
      ** not the case. In this case it is likely enough that the redundant
      ** xSync() call will be changed to a no-op by the OS anyhow. 
      */
      rc = syncJournal(pPager, 0);
      if( rc!=SQLITE_OK ) goto commit_phase_one_exit;
  
      rc = pager_write_pagelist(pPager,sqlite3PcacheDirtyList(pPager->pPCache));
      if( rc!=SQLITE_OK ){
        assert( rc!=SQLITE_IOERR_BLOCKED );
        goto commit_phase_one_exit;
      }
      sqlite3PcacheCleanAll(pPager->pPCache);

      /* If the file on disk is smaller than the database image, use 
      ** pager_truncate to grow the file here. This can happen if the database
      ** image was extended as part of the current transaction and then the
      ** last page in the db image moved to the free-list. In this case the
      ** last page is never written out to disk, leaving the database file
      ** undersized. Fix this now if it is the case.  */
      if( pPager->dbSize>pPager->dbFileSize ){
        Pgno nNew = pPager->dbSize - (pPager->dbSize==PAGER_MJ_PGNO(pPager));
        assert( pPager->eState==PAGER_WRITER_DBMOD );
        rc = pager_truncate(pPager, nNew);
        if( rc!=SQLITE_OK ) goto commit_phase_one_exit;
      }
  
      /* Finally, sync the database file. */
      if( !noSync ){
        rc = sqlite3PagerSync(pPager, zMaster);
      }
      IOTRACE(("DBSYNC %p\n", pPager))
    }
  }

commit_phase_one_exit:
  if( rc==SQLITE_OK && !pagerUseWal(pPager) ){
    pPager->eState = PAGER_WRITER_FINISHED;
  }
  return rc;
}